

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O0

bool myutils::check_connect(SOCKET sock,int timeout_second)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  fd_set *in_RCX;
  timeval *in_R8;
  socklen_t local_14c;
  int ret;
  socklen_t len;
  int err;
  int r;
  fd_set wset;
  fd_set rset;
  SOCKET high_sock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point begin_time;
  int timeout_second_local;
  SOCKET sock_local;
  
  begin_time.__d.__r._4_4_ = timeout_second;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  while( true ) {
    do {
      local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_28.__r = (rep)std::chrono::operator-(&local_30,&local_20);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffffc8,
                 (int *)((long)&begin_time.__d.__r + 4));
      bVar1 = std::chrono::operator<
                        (&local_28,(duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffc8);
      if (!bVar1) {
        return false;
      }
      len = select(sock,(fd_set *)(wset.fds_bits + 0xf),(fd_set *)&err,in_RCX,in_R8);
    } while (((len == 0xffffffff) || (len == 0)) ||
            ((len == 0xffffffff &&
             ((piVar3 = __errno_location(), *piVar3 == 0xb ||
              (piVar3 = __errno_location(), *piVar3 == 0x73))))));
    if ((wset.fds_bits[(long)(sock / 0x40) + 0xf] & 1L << ((byte)((long)sock % 0x40) & 0x3f)) != 0)
    break;
    in_RCX = (fd_set *)(1L << ((byte)((long)sock % 0x40) & 0x3f));
    if ((*(ulong *)(&err + (long)(sock / 0x40) * 2) & (ulong)in_RCX) != 0) {
      return true;
    }
  }
  ret = 0;
  local_14c = 4;
  iVar2 = getsockopt(sock,1,4,&ret,&local_14c);
  if (iVar2 != 0) {
    ret = 1;
  }
  return ret == 0;
}

Assistant:

bool check_connect(SOCKET sock, int timeout_second) //, fd_set* rset, fd_set* wset)
    {
        auto begin_time = system_clock::now();

        while (system_clock::now() - begin_time < seconds(timeout_second)) {
            SOCKET high_sock = sock;

            fd_set rset, wset;
            int r = select(high_sock, &rset, &wset);
            if (r == -1 || r == 0 || is_EWOURLDBLOCK(r)) {
                continue;
            }
            else if (FD_ISSET(sock, &rset)) {
                int err = 0;
                socklen_t len = sizeof(err);
                int ret = getsockopt(sock, SOL_SOCKET, SO_ERROR, (char *)&err, &len);
                if (ret != 0) err = 1;

                return err == 0;
            }
            else if (FD_ISSET(sock, &wset)) {
                return true;
            }
        }

        return false;
    }